

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStorage.cpp
# Opt level: O0

void __thiscall OpenMD::DataStorage::reserve(DataStorage *this,size_t size)

{
  long in_RDI;
  size_type in_stack_00000018;
  vector<double,_std::allocator<double>_> *in_stack_00000020;
  size_type in_stack_00000028;
  vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
  *in_stack_00000030;
  
  if ((*(uint *)(in_RDI + 0x1b8) & 1) != 0) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::reserve
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_00000030,in_stack_00000028);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 2) != 0) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::reserve
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_00000030,in_stack_00000028);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 4) != 0) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::reserve
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_00000030,in_stack_00000028);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 8) != 0) {
    std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
    reserve(in_stack_00000030,in_stack_00000028);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 0x10) != 0) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::reserve
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_00000030,in_stack_00000028);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 0x20) != 0) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::reserve
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_00000030,in_stack_00000028);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 0x40) != 0) {
    std::vector<double,_std::allocator<double>_>::reserve(in_stack_00000020,in_stack_00000018);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 0x80) != 0) {
    std::vector<double,_std::allocator<double>_>::reserve(in_stack_00000020,in_stack_00000018);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 0x100) != 0) {
    std::vector<double,_std::allocator<double>_>::reserve(in_stack_00000020,in_stack_00000018);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 0x200) != 0) {
    std::vector<double,_std::allocator<double>_>::reserve(in_stack_00000020,in_stack_00000018);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 0x400) != 0) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::reserve
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_00000030,in_stack_00000028);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 0x800) != 0) {
    std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
    reserve(in_stack_00000030,in_stack_00000028);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 0x1000) != 0) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::reserve
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_00000030,in_stack_00000028);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 0x2000) != 0) {
    std::vector<double,_std::allocator<double>_>::reserve(in_stack_00000020,in_stack_00000018);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 0x4000) != 0) {
    std::vector<double,_std::allocator<double>_>::reserve(in_stack_00000020,in_stack_00000018);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 0x8000) != 0) {
    std::vector<double,_std::allocator<double>_>::reserve(in_stack_00000020,in_stack_00000018);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 0x10000) != 0) {
    std::vector<double,_std::allocator<double>_>::reserve(in_stack_00000020,in_stack_00000018);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 0x20000) != 0) {
    std::vector<double,_std::allocator<double>_>::reserve(in_stack_00000020,in_stack_00000018);
  }
  return;
}

Assistant:

void DataStorage::reserve(std::size_t size) {
    if (storageLayout_ & dslPosition) { position.reserve(size); }

    if (storageLayout_ & dslVelocity) { velocity.reserve(size); }

    if (storageLayout_ & dslForce) { force.reserve(size); }

    if (storageLayout_ & dslAmat) { aMat.reserve(size); }

    if (storageLayout_ & dslAngularMomentum) { angularMomentum.reserve(size); }

    if (storageLayout_ & dslTorque) { torque.reserve(size); }

    if (storageLayout_ & dslParticlePot) { particlePot.reserve(size); }

    if (storageLayout_ & dslDensity) { density.reserve(size); }

    if (storageLayout_ & dslFunctional) { functional.reserve(size); }

    if (storageLayout_ & dslFunctionalDerivative) {
      functionalDerivative.reserve(size);
    }

    if (storageLayout_ & dslDipole) { dipole.reserve(size); }

    if (storageLayout_ & dslQuadrupole) { quadrupole.reserve(size); }

    if (storageLayout_ & dslElectricField) { electricField.reserve(size); }

    if (storageLayout_ & dslSkippedCharge) { skippedCharge.reserve(size); }

    if (storageLayout_ & dslFlucQPosition) { flucQPos.reserve(size); }

    if (storageLayout_ & dslFlucQVelocity) { flucQVel.reserve(size); }

    if (storageLayout_ & dslFlucQForce) { flucQFrc.reserve(size); }

    if (storageLayout_ & dslSitePotential) { sitePotential.reserve(size); }
  }